

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O1

short duckdb::GetInternalCValue<short,duckdb::TryCast>(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  short sVar2;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      sVar2 = TryCastCInternal<bool,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_TINYINT:
      sVar2 = TryCastCInternal<signed_char,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_SMALLINT:
      sVar2 = TryCastCInternal<short,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_INTEGER:
      sVar2 = TryCastCInternal<int,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_BIGINT:
      sVar2 = TryCastCInternal<long,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_UTINYINT:
      sVar2 = TryCastCInternal<unsigned_char,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_USMALLINT:
      sVar2 = TryCastCInternal<unsigned_short,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_UINTEGER:
      sVar2 = TryCastCInternal<unsigned_int,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_UBIGINT:
      sVar2 = TryCastCInternal<unsigned_long,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_FLOAT:
      sVar2 = TryCastCInternal<float,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_DOUBLE:
      sVar2 = TryCastCInternal<double,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      sVar2 = TryCastCInternal<duckdb::timestamp_t,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_DATE:
      sVar2 = TryCastCInternal<duckdb::date_t,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_TIME:
      sVar2 = TryCastCInternal<duckdb::dtime_t,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_INTERVAL:
      sVar2 = TryCastCInternal<duckdb::interval_t,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_HUGEINT:
      sVar2 = TryCastCInternal<duckdb::hugeint_t,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_VARCHAR:
      sVar2 = TryCastCInternal<char*,short,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return sVar2;
    case DUCKDB_TYPE_DECIMAL:
      sVar2 = TryCastDecimalCInternal<short>(result,col,row);
      return sVar2;
    case DUCKDB_TYPE_UHUGEINT:
      sVar2 = TryCastCInternal<duckdb::uhugeint_t,short,duckdb::TryCast>(result,col,row);
      return sVar2;
    }
  }
  return 0;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}